

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O0

void Mig_ObjSetFaninLit(Mig_Obj_t *p,int i,int l)

{
  int iVar1;
  int l_local;
  int i_local;
  Mig_Obj_t *p_local;
  
  if (-1 < l) {
    iVar1 = Mig_ObjId(p);
    if (l >> 1 < iVar1) {
      iVar1 = Abc_Lit2Var(l);
      Mig_FanSetId(p,i,iVar1);
      iVar1 = Abc_LitIsCompl(l);
      Mig_FanSetCompl(p,i,iVar1);
      return;
    }
  }
  __assert_fail("l >= 0 && (l >> 1) < Mig_ObjId(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                ,0xba,"void Mig_ObjSetFaninLit(Mig_Obj_t *, int, int)");
}

Assistant:

static inline void         Mig_ObjSetFaninLit( Mig_Obj_t * p, int i, int l )   { assert( l >= 0 && (l >> 1) < Mig_ObjId(p) ); Mig_FanSetId(p, i, Abc_Lit2Var(l)); Mig_FanSetCompl(p, i, Abc_LitIsCompl(l));       }